

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O2

pair<unsigned_long,_unsigned_long> WeakHashLen32WithSeeds(char *s,uint64 a,uint64 b)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  
  lVar3 = a + *(long *)s;
  uVar2 = b + *(long *)(s + 0x18) + lVar3;
  uVar1 = *(long *)(s + 8) + lVar3 + *(long *)(s + 0x10);
  pVar4.first = uVar1 + *(long *)(s + 0x18);
  pVar4.second = (uVar2 << 0x2b | uVar2 >> 0x15) + lVar3 + (uVar1 * 0x100000 | uVar1 >> 0x2c);
  return pVar4;
}

Assistant:

static pair<uint64, uint64> WeakHashLen32WithSeeds(
    const char* s, uint64 a, uint64 b) {
  return WeakHashLen32WithSeeds(Fetch64(s),
                                Fetch64(s + 8),
                                Fetch64(s + 16),
                                Fetch64(s + 24),
                                a,
                                b);
}